

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierBuilder.cpp
# Opt level: O3

void __thiscall Refal2::CQualifierBuilder::AddChar(CQualifierBuilder *this,TChar c)

{
  _WordT *p_Var1;
  bool bVar2;
  undefined7 in_register_00000031;
  ulong __position;
  char local_11;
  
  if (c < '\0') {
    if (this->negative == true) {
      CSetBuilder<char>::Exclude(&this->charsBuilder,&local_11);
    }
    else {
      CSetBuilder<char>::Include(&this->charsBuilder,&local_11);
    }
  }
  else {
    __position = (ulong)(int)CONCAT71(in_register_00000031,c);
    bVar2 = std::bitset<128UL>::test(&this->ansicharsFixed,__position);
    if (!bVar2) {
      std::bitset<128UL>::set(&this->ansichars,__position,(bool)(this->negative ^ 1));
      p_Var1 = (this->ansicharsFixed).super__Base_bitset<2UL>._M_w + (__position >> 6);
      *p_Var1 = *p_Var1 | 1L << (c & 0x3fU);
    }
  }
  return;
}

Assistant:

void CQualifierBuilder::AddChar( const TChar c )
{
	std::size_t tmpc = static_cast<std::size_t>( c );
	if( tmpc < AnsiSetSize ) {
		if( !ansicharsFixed.test( tmpc ) ) {
			ansichars.set( tmpc, !negative );
			ansicharsFixed.set( tmpc );
		}
	} else {
		if( negative ) {
			charsBuilder.Exclude( c );
		} else {
			charsBuilder.Include( c );
		}
	}
}